

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void adios2sys::SystemTools::ReplaceString(string *source,char *replace,char *with)

{
  char *in_RDX;
  char *in_RSI;
  char *local_70;
  allocator local_39;
  string *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  
  if (*in_RSI != '\0') {
    strlen(in_RSI);
    local_70 = in_RDX;
    if (in_RDX == (char *)0x0) {
      local_70 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,local_70,&local_39);
    SystemToolsStatic::ReplaceString
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void SystemTools::ReplaceString(std::string& source, const char* replace,
                                const char* with)
{
  // do while hangs if replaceSize is 0
  if (!*replace) {
    return;
  }

  SystemToolsStatic::ReplaceString(source, replace, strlen(replace),
                                   with ? with : "");
}